

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv4address.cpp
# Opt level: O0

bool __thiscall jrtplib::RTPIPv4Address::IsSameAddress(RTPIPv4Address *this,RTPAddress *addr)

{
  uint16_t uVar1;
  AddressType AVar2;
  uint32_t uVar3;
  RTPIPv4Address *addr2;
  RTPAddress *addr_local;
  RTPIPv4Address *this_local;
  
  if ((((addr != (RTPAddress *)0x0) &&
       (AVar2 = RTPAddress::GetAddressType(addr), AVar2 == IPv4Address)) &&
      (uVar3 = GetIP((RTPIPv4Address *)addr),
      uVar3 == *(uint32_t *)&(this->super_RTPAddress).field_0xc)) &&
     (uVar1 = GetPort((RTPIPv4Address *)addr), uVar1 == this->port)) {
    return true;
  }
  return false;
}

Assistant:

bool RTPIPv4Address::IsSameAddress(const RTPAddress *addr) const
{
	if (addr == 0)
		return false;
	if (addr->GetAddressType() != IPv4Address)
		return false;

	const RTPIPv4Address *addr2 = (const RTPIPv4Address *)addr;
	if (addr2->GetIP() == ip && addr2->GetPort() == port)
		return true;
	return false;
}